

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O0

void sq_newtable(HSQUIRRELVM v)

{
  SQTable *x;
  SQVM *in_RDI;
  SQSharedState *in_stack_ffffffffffffffd0;
  SQObjectPtr *this;
  SQObjectPtr *in_stack_ffffffffffffffd8;
  SQVM *in_stack_ffffffffffffffe0;
  SQObjectPtr local_18;
  SQVM *local_8;
  
  local_8 = in_RDI;
  SQVM::ValidateThreadAccess(in_RDI);
  x = SQTable::Create(in_stack_ffffffffffffffd0,(SQInteger)local_8);
  this = &local_18;
  SQObjectPtr::SQObjectPtr(this,x);
  SQVM::Push(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  SQObjectPtr::~SQObjectPtr(this);
  return;
}

Assistant:

void sq_newtable(HSQUIRRELVM v)
{
    v->ValidateThreadAccess();
    v->Push(SQTable::Create(_ss(v), 0));
}